

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O1

void __thiscall
IContactList::ConfigSave(IContactList *this,IConfigManager *pConfigManager,char *pCmdStr)

{
  int iVar1;
  long lVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  char aBuf [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < this->m_NumContacts) {
    pcVar6 = this->m_aContacts[0].m_aName + 1;
    pcVar5 = this->m_aContacts[0].m_aClan + 1;
    lVar9 = 0;
    do {
      str_copy(local_b8,pCmdStr,0x80);
      iVar1 = str_length(local_b8);
      lVar8 = (long)iVar1;
      pcVar7 = local_b8 + lVar8 + 1;
      local_b8[lVar8] = '\"';
      cVar3 = this->m_aContacts[lVar9].m_aName[0];
      pcVar4 = pcVar6;
      lVar2 = lVar8;
      if (iVar1 < 0x7b && cVar3 != '\0') {
        do {
          lVar8 = lVar2 + 1;
          if ((cVar3 == '\\') || (cVar3 == '\"')) {
            lVar8 = lVar2 + 2;
            *pcVar7 = '\\';
          }
          pcVar7 = local_b8 + lVar8 + 1;
          local_b8[lVar8] = cVar3;
          if (0x7a < lVar8) break;
          cVar3 = *pcVar4;
          pcVar4 = pcVar4 + 1;
          lVar2 = lVar8;
        } while (cVar3 != '\0');
      }
      pcVar4 = local_b8 + lVar8 + 4;
      local_b8[lVar8 + 1] = '\"';
      pcVar7[1] = ' ';
      pcVar7[2] = '\"';
      cVar3 = this->m_aContacts[lVar9].m_aClan[0];
      if ((cVar3 != '\0') && (lVar8 < 0x78)) {
        lVar8 = lVar8 + 4;
        pcVar7 = pcVar5;
        do {
          if ((cVar3 == '\\') || (lVar2 = lVar8, cVar3 == '\"')) {
            lVar2 = lVar8 + 1;
            *pcVar4 = '\\';
          }
          pcVar4 = local_b8 + lVar2 + 1;
          local_b8[lVar2] = cVar3;
          cVar3 = *pcVar7;
          if (cVar3 == '\0') break;
          lVar8 = lVar2 + 1;
          pcVar7 = pcVar7 + 1;
        } while (lVar2 < 0x7b);
      }
      pcVar4[0] = '\"';
      pcVar4[1] = '\0';
      (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_b8);
      lVar9 = lVar9 + 1;
      pcVar6 = pcVar6 + 0x7c;
      pcVar5 = pcVar5 + 0x7c;
    } while (lVar9 < this->m_NumContacts);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void IContactList::ConfigSave(IConfigManager *pConfigManager, const char* pCmdStr)
{
	char aBuf[128];
	const char *pEnd = aBuf+sizeof(aBuf)-4;
	for(int i = 0; i < this->m_NumContacts; ++i)
	{
		str_copy(aBuf, pCmdStr, sizeof(aBuf));

		const char *pSrc = this->m_aContacts[i].m_aName;
		char *pDst = aBuf+str_length(aBuf);
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = ' ';

		pSrc = this->m_aContacts[i].m_aClan;
		*pDst++ = '"';
		while(*pSrc && pDst < pEnd)
		{
			if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
				*pDst++ = '\\';
			*pDst++ = *pSrc++;
		}
		*pDst++ = '"';
		*pDst++ = 0;

		pConfigManager->WriteLine(aBuf);
	}
}